

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O2

int deqp::gles31::Functional::findMSB(deInt32 value)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  if (0 < value) {
    iVar1 = 0x1f;
    if (value != 0) {
      for (; (uint)value >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    return iVar1;
  }
  if (-1 < value) {
    return -1;
  }
  uVar3 = value ^ 0xffffffff;
  if (uVar3 == 0) {
    uVar2 = 0x20;
  }
  else {
    uVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = uVar2 ^ 0x1f;
  }
  return 0x1f - uVar2;
}

Assistant:

static int findMSB (deInt32 value)
{
	if (value > 0)
		return 31 - deClz32((deUint32)value);
	else if (value < 0)
		return 31 - deClz32(~(deUint32)value);
	else
		return -1;
}